

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::TryFindSymbolInFallbackDatabase(DescriptorPool *this,string *name)

{
  bool bVar1;
  byte bVar2;
  size_type sVar3;
  undefined8 in_RSI;
  long in_RDI;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar4;
  FileDescriptorProto *unaff_retaddr;
  DescriptorPool *in_stack_00000008;
  FileDescriptorProto file_proto;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  Tables *in_stack_fffffffffffffec0;
  FileDescriptorProto *in_stack_ffffffffffffff00;
  undefined1 local_f0 [48];
  string *in_stack_ffffffffffffff40;
  DescriptorPool *in_stack_ffffffffffffff48;
  bool local_1;
  
  if (*(long *)(in_RDI + 8) == 0) {
    return false;
  }
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                *)0x4a13d6);
  sVar3 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffeb0._M_cur,
                  (key_type *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  if (sVar3 != 0) {
    return false;
  }
  FileDescriptorProto::FileDescriptorProto(in_stack_ffffffffffffff00);
  bVar1 = IsSubSymbolOfBuiltType(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  if ((!bVar1) &&
     (bVar2 = (**(code **)(**(long **)(in_RDI + 8) + 0x18))(*(long **)(in_RDI + 8),in_RSI,local_f0),
     (bVar2 & 1) != 0)) {
    std::
    unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
    ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  *)0x4a146a);
    FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)0x4a1479);
    in_stack_fffffffffffffec0 =
         (Tables *)Tables::FindFile(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if ((in_stack_fffffffffffffec0 == (Tables *)0x0) &&
       (in_stack_fffffffffffffeb8 = (string *)BuildFileFromDatabase(in_stack_00000008,unaff_retaddr)
       , in_stack_fffffffffffffeb8 != (string *)0x0)) {
      local_1 = true;
      goto LAB_004a153d;
    }
  }
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                *)0x4a14d0);
  pVar4 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  in_stack_fffffffffffffeb0._M_cur =
       (__node_type *)
       pVar4.first.
       super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
       ._M_cur;
  local_1 = false;
LAB_004a153d:
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)in_stack_fffffffffffffeb0._M_cur)
  ;
  return local_1;
}

Assistant:

bool DescriptorPool::TryFindSymbolInFallbackDatabase(
    const std::string& name) const {
  if (fallback_database_ == nullptr) return false;

  if (tables_->known_bad_symbols_.count(name) > 0) return false;

  FileDescriptorProto file_proto;
  if (  // We skip looking in the fallback database if the name is a sub-symbol
        // of any descriptor that already exists in the descriptor pool (except
        // for package descriptors).  This is valid because all symbols except
        // for packages are defined in a single file, so if the symbol exists
        // then we should already have its definition.
        //
        // The other reason to do this is to support "overriding" type
        // definitions by merging two databases that define the same type. (Yes,
        // people do this.)  The main difficulty with making this work is that
        // FindFileContainingSymbol() is allowed to return both false positives
        // (e.g., SimpleDescriptorDatabase, UpgradedDescriptorDatabase) and
        // false negatives (e.g. ProtoFileParser, SourceTreeDescriptorDatabase).
        // When two such databases are merged, looking up a non-existent
        // sub-symbol of a type that already exists in the descriptor pool can
        // result in an attempt to load multiple definitions of the same type.
        // The check below avoids this.
      IsSubSymbolOfBuiltType(name)

      // Look up file containing this symbol in fallback database.
      || !fallback_database_->FindFileContainingSymbol(name, &file_proto)

      // Check if we've already built this file. If so, it apparently doesn't
      // contain the symbol we're looking for.  Some DescriptorDatabases
      // return false positives.
      || tables_->FindFile(file_proto.name()) != nullptr

      // Build the file.
      || BuildFileFromDatabase(file_proto) == nullptr) {
    tables_->known_bad_symbols_.insert(name);
    return false;
  }

  return true;
}